

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::ShaderRenderCase::render
          (ShaderRenderCase *this,Surface *result,int programID,QuadGrid *quadGrid)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  pointer pVVar4;
  RenderContext *context;
  ulong uVar5;
  QuadGrid *pQVar6;
  ulong uVar7;
  ShaderRenderCase *pSVar8;
  int iVar9;
  deUint32 dVar10;
  int iVar11;
  int iVar12;
  deUint32 dVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar14;
  ulong uVar15;
  void *data;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar16;
  long lVar17;
  long lVar18;
  string name;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  Random rnd;
  TextureFormat local_280;
  long *local_278;
  undefined4 local_270;
  uint uStack_26c;
  long local_268 [2];
  int local_258;
  QuadGrid *local_250;
  long *local_248;
  long local_240;
  long local_238;
  ulong uStack_230;
  uint local_224;
  ulong local_220;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> local_218;
  int local_1f8;
  int local_1f4;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  pointer local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  int local_1a8;
  VertexArrayPointer local_1a0 [2];
  ios_base local_160 [264];
  ulong local_58;
  Surface *local_50;
  ShaderRenderCase *local_48;
  deRandom local_40;
  
  local_250 = quadGrid;
  local_224 = programID;
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar17 = CONCAT44(extraout_var,iVar9);
  dVar10 = (**(code **)(lVar17 + 0x800))();
  glu::checkError(dVar10,"pre render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderRenderCase.cpp"
                  ,0x252);
  local_220 = CONCAT44(local_220._4_4_,result->m_width);
  iVar9 = result->m_height;
  local_50 = result;
  iVar11 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar11 = *(int *)CONCAT44(extraout_var_00,iVar11);
  iVar12 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar12 = *(int *)(CONCAT44(extraout_var_01,iVar12) + 4);
  dVar10 = deStringHash((this->m_vertShaderSource)._M_dataplus._M_p);
  dVar13 = deStringHash((this->m_fragShaderSource)._M_dataplus._M_p);
  deRandom_init(&local_40,dVar10 + dVar13);
  dVar10 = deRandom_getUint32(&local_40);
  uVar7 = local_220;
  uVar15 = (ulong)dVar10 % (ulong)((iVar11 - (int)local_220) + 1);
  dVar10 = deRandom_getUint32(&local_40);
  uVar5 = (ulong)dVar10 % (ulong)((iVar12 - iVar9) + 1);
  local_1f4 = (int)uVar15;
  (**(code **)(lVar17 + 0x1a00))(uVar15,uVar5,uVar7 & 0xffffffff);
  uVar2 = local_224;
  pQVar6 = local_250;
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
            (this,(ulong)local_224,&local_250->m_constCoords);
  setupDefaultInputs(this,uVar2);
  local_48 = this;
  (**(code **)(lVar17 + 0x1c0))
            ((this->m_clearColor).m_data[0],(this->m_clearColor).m_data[1],
             (this->m_clearColor).m_data[2],(this->m_clearColor).m_data[3]);
  local_220 = lVar17;
  (**(code **)(lVar17 + 0x188))(0x4000);
  local_218.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_start = (VertexArrayBinding *)0x0;
  local_218.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar9 = pQVar6->m_numVertices;
  uVar2 = pQVar6->m_numTriangles;
  local_238 = 0x697469736f705f61;
  local_240 = 10;
  uStack_230 = CONCAT53(uStack_230._3_5_,0x6e6f);
  pVVar4 = (pQVar6->m_positions).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_280.order = A;
  local_278 = local_268;
  local_248 = &local_238;
  std::__cxx11::string::_M_construct<char*>((string *)&local_278,&local_238);
  local_258 = 0;
  local_1d0._0_4_ = local_280.order;
  local_1c8._M_p = (pointer)&local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_278,CONCAT44(uStack_26c,local_270) + (long)local_278);
  local_1a8 = local_258;
  local_1a0[0].componentType = VTX_COMP_FLOAT;
  local_1a0[0].convert = VTX_COMP_CONVERT_NONE;
  local_1a0[0].numComponents = 4;
  local_1a0[0].stride = 0;
  local_1a0[0].numElements = iVar9;
  local_1a0[0].data = pVVar4;
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0] + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_218,(VertexArrayBinding *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  local_238 = 0x7364726f6f635f61;
  local_240 = 8;
  uStack_230 = uStack_230 & 0xffffffffffffff00;
  pVVar4 = (local_250->m_coords).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_280.order = A;
  local_278 = local_268;
  local_248 = &local_238;
  std::__cxx11::string::_M_construct<char*>((string *)&local_278,&local_238);
  local_258 = 0;
  local_1d0._0_4_ = local_280.order;
  local_1c8._M_p = (pointer)&local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_278,CONCAT44(uStack_26c,local_270) + (long)local_278);
  local_1a8 = local_258;
  local_1a0[0].componentType = VTX_COMP_FLOAT;
  local_1a0[0].convert = VTX_COMP_CONVERT_NONE;
  local_1a0[0].numComponents = 4;
  local_1a0[0].stride = 0;
  local_1a0[0].numElements = iVar9;
  local_1a0[0].data = pVVar4;
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0] + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_218,(VertexArrayBinding *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  local_238 = 0x6f4374696e755f61;
  local_240 = 0xc;
  uStack_230 = CONCAT35(uStack_230._5_3_,0x7364726f);
  pVVar4 = (local_250->m_unitCoords).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_280.order = A;
  local_278 = local_268;
  local_248 = &local_238;
  std::__cxx11::string::_M_construct<char*>((string *)&local_278,&local_238);
  local_258 = 0;
  local_1d0._0_4_ = local_280.order;
  local_1c8._M_p = (pointer)&local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_278,CONCAT44(uStack_26c,local_270) + (long)local_278);
  local_1a8 = local_258;
  local_1a0[0].componentType = VTX_COMP_FLOAT;
  local_1a0[0].convert = VTX_COMP_CONVERT_NONE;
  local_1a0[0].numComponents = 4;
  local_1a0[0].stride = 0;
  local_1a0[0].numElements = iVar9;
  local_1a0[0].data = pVVar4;
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0] + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_218,(VertexArrayBinding *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  local_238 = CONCAT26(local_238._6_2_,0x656e6f5f61);
  local_240 = 5;
  pVVar4 = (pointer)(local_250->m_attribOne).super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  local_280.order = A;
  local_278 = local_268;
  local_248 = &local_238;
  std::__cxx11::string::_M_construct<char*>((string *)&local_278,&local_238);
  local_258 = 0;
  local_1d0._0_4_ = local_280.order;
  local_1c8._M_p = (pointer)&local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_278,CONCAT44(uStack_26c,local_270) + (long)local_278);
  local_1a8 = local_258;
  local_1a0[0].componentType = VTX_COMP_FLOAT;
  local_1a0[0].convert = VTX_COMP_CONVERT_NONE;
  local_1a0[0].numComponents = 1;
  local_1a0[0].stride = 0;
  local_1a0[0].numElements = iVar9;
  local_1a0[0].data = pVVar4;
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0] + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_218,(VertexArrayBinding *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  local_1f8 = (int)uVar5;
  local_58 = (ulong)uVar2;
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (0 < (int)((ulong)((long)(local_250->m_userAttribTransforms).
                              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_250->m_userAttribTransforms).
                             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    pvVar16 = local_250->m_userAttribs;
    lVar17 = 0;
    do {
      local_280 = (TextureFormat)&local_270;
      local_270 = 0x6e695f61;
      local_278 = (long *)0x4;
      uStack_26c = uStack_26c & 0xffffff00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
      std::ostream::operator<<((VertexArrayBinding *)local_1d0,(int)lVar17);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
      std::ios_base::~ios_base(local_160);
      uVar15 = 0xf;
      if (local_280 != (TextureFormat)&local_270) {
        uVar15 = CONCAT44(uStack_26c,local_270);
      }
      if (uVar15 < (ulong)(local_1e8 + (long)local_278)) {
        uVar15 = 0xf;
        if (local_1f0 != local_1e0) {
          uVar15 = local_1e0[0];
        }
        if (uVar15 < (ulong)(local_1e8 + (long)local_278)) goto LAB_01820108;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_280);
      }
      else {
LAB_01820108:
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1f0)
        ;
      }
      plVar1 = puVar14 + 2;
      if ((long *)*puVar14 == plVar1) {
        local_238 = *plVar1;
        uStack_230 = puVar14[3];
        local_248 = &local_238;
      }
      else {
        local_238 = *plVar1;
        local_248 = (long *)*puVar14;
      }
      local_240 = puVar14[1];
      *puVar14 = plVar1;
      puVar14[1] = 0;
      *(undefined1 *)plVar1 = 0;
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
      if (local_280 != (TextureFormat)&local_270) {
        operator_delete((void *)local_280,CONCAT44(uStack_26c,local_270) + 1);
      }
      pVVar4 = (pvVar16->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_280.order = A;
      local_278 = local_268;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,local_248,(undefined1 *)(local_240 + (long)local_248));
      local_258 = 0;
      local_1d0._0_4_ = local_280.order;
      local_1c8._M_p = (pointer)&local_1b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,local_278,CONCAT44(uStack_26c,local_270) + (long)local_278);
      local_1a8 = local_258;
      local_1a0[0].componentType = VTX_COMP_FLOAT;
      local_1a0[0].convert = VTX_COMP_CONVERT_NONE;
      local_1a0[0].numComponents = 4;
      local_1a0[0].stride = 0;
      local_1a0[0].numElements = iVar9;
      local_1a0[0].data = pVVar4;
      if (local_278 != local_268) {
        operator_delete(local_278,local_268[0] + 1);
      }
      std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
      emplace_back<glu::VertexArrayBinding>(&local_218,(VertexArrayBinding *)local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_p != &local_1b8) {
        operator_delete(local_1c8._M_p,
                        CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) +
                        1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      lVar17 = lVar17 + 1;
      pvVar16 = pvVar16 + 1;
    } while (lVar17 < (int)((ulong)((long)(local_250->m_userAttribTransforms).
                                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(local_250->m_userAttribTransforms).
                                         super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 6));
  }
  lVar17 = 0;
  do {
    iVar11 = (**(code **)(local_220 + 0x780))
                       (local_224,
                        (&getDefaultVertexArrays(glw::Functions_const&,deqp::gls::QuadGrid_const&,unsigned_int,std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>&)
                          ::matrices)[lVar17 * 2]);
    if ((-1 < iVar11) && (iVar12 = (&DAT_0217ad78)[lVar17 * 4], 0 < (long)iVar12)) {
      iVar3 = (&DAT_0217ad7c)[lVar17 * 4];
      lVar18 = 0;
      do {
        local_1a0[0].data =
             *(void **)((long)&local_250->m_userAttribs[0].
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar18);
        local_1d0._0_4_ = TYPE_LOCATION;
        local_1c0 = (pointer)0x0;
        local_1b8._M_local_buf[0] = '\0';
        local_1a0[0].componentType = VTX_COMP_FLOAT;
        local_1a0[0].convert = VTX_COMP_CONVERT_NONE;
        local_1a0[0].stride = 0x10;
        local_1c8._M_p = (pointer)&local_1b8;
        local_1a8 = iVar11;
        local_1a0[0].numComponents = iVar3;
        local_1a0[0].numElements = iVar9;
        std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
        emplace_back<glu::VertexArrayBinding>(&local_218,(VertexArrayBinding *)local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_p != &local_1b8) {
          operator_delete(local_1c8._M_p,
                          CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0])
                          + 1);
        }
        lVar18 = lVar18 + 0x18;
        iVar11 = iVar11 + 1;
      } while ((long)iVar12 * 0x18 != lVar18);
    }
    pSVar8 = local_48;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 9);
  local_1d0._4_4_ = (int)local_58 * 3;
  local_1c0 = (local_250->m_indices).
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_1d0._0_4_ = TYPE_LOCATION;
  local_1c8._M_p._0_4_ = 1;
  glu::draw(local_48->m_renderCtx,local_224,
            (int)((ulong)((long)local_218.
                                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_218.
                               super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333,
            local_218.
            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
            _M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)local_1d0,
            (DrawUtilCallback *)0x0);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            (&local_218);
  dVar10 = (**(code **)(local_220 + 0x800))();
  glu::checkError(dVar10,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderRenderCase.cpp"
                  ,0x273);
  iVar9 = local_1f4;
  context = pSVar8->m_renderCtx;
  local_280.order = RGBA;
  local_280.type = UNORM_INT8;
  data = (void *)(local_50->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (local_50->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1d0,&local_280,local_50->m_width,local_50->m_height,1,data);
  glu::readPixels(context,iVar9,local_1f8,(PixelBufferAccess *)local_1d0);
  dVar10 = (**(code **)(local_220 + 0x800))();
  glu::checkError(dVar10,"post render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderRenderCase.cpp"
                  ,0x278);
  return;
}

Assistant:

void ShaderRenderCase::render (Surface& result, int programID, const QuadGrid& quadGrid)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	GLU_EXPECT_NO_ERROR(gl.getError(), "pre render");

	// Buffer info.
	int				width		= result.getWidth();
	int				height		= result.getHeight();

	int				xOffsetMax	= m_renderCtx.getRenderTarget().getWidth() - width;
	int				yOffsetMax	= m_renderCtx.getRenderTarget().getHeight() - height;

	deUint32		hash		= deStringHash(m_vertShaderSource.c_str()) + deStringHash(m_fragShaderSource.c_str());
	de::Random		rnd			(hash);

	int				xOffset		= rnd.getInt(0, xOffsetMax);
	int				yOffset		= rnd.getInt(0, yOffsetMax);

	gl.viewport(xOffset, yOffset, width, height);

	// Setup program.
	setupUniforms(programID, quadGrid.getConstCoords());
	setupDefaultInputs(programID);

	// Clear.
	gl.clearColor(m_clearColor.x(), m_clearColor.y(), m_clearColor.z(), m_clearColor.w());
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Draw.
	{
		std::vector<VertexArrayBinding>	vertexArrays;
		const int						numElements		= quadGrid.getNumTriangles()*3;

		getDefaultVertexArrays(gl, quadGrid, programID, vertexArrays);
		draw(m_renderCtx, programID, (int)vertexArrays.size(), &vertexArrays[0], pr::Triangles(numElements, quadGrid.getIndices()));
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

	// Read back results.
	glu::readPixels(m_renderCtx, xOffset, yOffset, result.getAccess());

	GLU_EXPECT_NO_ERROR(gl.getError(), "post render");
}